

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::SparseTextureAllocationTestCase::verifyTexStorageInvalidValueErrors
          (SparseTextureAllocationTestCase *this,Functions *gl,GLint target,GLint format)

{
  GLint height;
  GLint width;
  bool bVar1;
  GLenum GVar2;
  char *funcName;
  GLuint depth;
  stringstream *log;
  GLuint texture;
  GLint max3DTextureSize;
  GLuint local_54;
  GLint maxArrayTextureLayers;
  GLint pageSizeZ;
  GLint pageSizeY;
  GLint pageSizeX;
  stringstream *local_40;
  SparseTextureAllocationTestCase *local_38;
  
  local_40 = &this->mLog;
  local_38 = this;
  std::operator<<((ostream *)&this->field_0x88,"Verify Invalid Value errors - ");
  SparseTextureUtils::getTexturePageSizes(gl,target,format,&pageSizeX,&pageSizeY,&pageSizeZ);
  gl4cts::Texture::Generate(gl,&texture);
  gl4cts::Texture::Bind(gl,texture,target);
  width = pageSizeX;
  height = pageSizeY;
  local_54 = SparseTextureUtils::getTargetDepth(target);
  depth = pageSizeZ * local_54;
  if (target == 0x806f) {
    (*gl->getIntegerv)(0x9199,&max3DTextureSize);
    GVar2 = (*gl->getError)();
    log = local_40;
    bVar1 = SparseTextureUtils::verifyQueryError(local_40,"getIntegerv",0x806f,0x9199,GVar2,0);
    if (!bVar1) goto LAB_00ad4fec;
    (*gl->texStorage3D)(0x806f,1,format,max3DTextureSize + width,height,depth);
    GVar2 = (*gl->getError)();
    bVar1 = SparseTextureUtils::verifyError
                      (log,"TexStorage [GL_TEXTURE_3D wrong width]",GVar2,0x501);
    if (!bVar1) goto LAB_00ad4fec;
    (*gl->texStorage3D)(0x806f,1,format,width,max3DTextureSize + height,depth);
    GVar2 = (*gl->getError)();
    bVar1 = SparseTextureUtils::verifyError
                      (log,"TexStorage [GL_TEXTURE_3D wrong height]",GVar2,0x501);
    if (!bVar1) goto LAB_00ad4fec;
    (*gl->texStorage3D)(0x806f,1,format,width,height,max3DTextureSize + depth);
    GVar2 = (*gl->getError)();
    funcName = "TexStorage [GL_TEXTURE_3D wrong depth]";
    goto LAB_00ad4d82;
  }
  (*gl->getIntegerv)(0x9198,&max3DTextureSize);
  GVar2 = (*gl->getError)();
  log = local_40;
  bVar1 = SparseTextureUtils::verifyQueryError(local_40,"getIntegerv",target,0x9198,GVar2,0);
  if (!bVar1) goto LAB_00ad4fec;
  gl4cts::Texture::Storage(gl,target,1,format,max3DTextureSize + width,height,depth);
  GVar2 = (*gl->getError)();
  bVar1 = SparseTextureUtils::verifyError(log,"TexStorage [!GL_TEXTURE_3D wrong width]",GVar2,0x501)
  ;
  if (!bVar1) goto LAB_00ad4fec;
  gl4cts::Texture::Storage(gl,target,1,format,width,max3DTextureSize + height,depth);
  GVar2 = (*gl->getError)();
  bVar1 = SparseTextureUtils::verifyError
                    (log,"TexStorage [!GL_TEXTURE_3D wrong height]",GVar2,0x501);
  if (!bVar1) goto LAB_00ad4fec;
  (*gl->getIntegerv)(0x919a,&maxArrayTextureLayers);
  GVar2 = (*gl->getError)();
  bVar1 = SparseTextureUtils::verifyQueryError(log,"getIntegerv",target,0x919a,GVar2,0);
  if (!bVar1) goto LAB_00ad4fec;
  if ((target == 0x9009) || (target == 0x8c1a)) {
    gl4cts::Texture::Storage(gl,target,1,format,width,height,maxArrayTextureLayers + depth);
    GVar2 = (*gl->getError)();
    funcName = "TexStorage [ARRAY wrong depth]";
LAB_00ad4d82:
    bVar1 = SparseTextureUtils::verifyError(log,funcName,GVar2,0x501);
    if (!bVar1) goto LAB_00ad4fec;
  }
  else if (target == 0x8c18) {
    (*gl->texStorage2D)(0x8c18,1,format,width,0);
    GVar2 = (*gl->getError)();
    funcName = "TexStorage [ARRAY wrong height]";
    goto LAB_00ad4d82;
  }
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((local_38->super_TestCase).m_context)->m_contextInfo,"GL_ARB_sparse_texture2")
  ;
  if (!bVar1) {
    if (1 < pageSizeX) {
      gl4cts::Texture::Storage(gl,target,1,format,1,height,depth);
      GVar2 = (*gl->getError)();
      bVar1 = SparseTextureUtils::verifyError(log,"TexStorage [wrong width]",GVar2,0x501);
      if (!bVar1) goto LAB_00ad4fec;
    }
    if (1 < pageSizeY) {
      gl4cts::Texture::Storage(gl,target,1,format,width,1,depth);
      GVar2 = (*gl->getError)();
      bVar1 = SparseTextureUtils::verifyError(log,"TexStorage [wrong height]",GVar2,0x501);
      if (!bVar1) goto LAB_00ad4fec;
    }
    if (1 < pageSizeZ) {
      gl4cts::Texture::Storage(gl,target,1,format,width,height,local_54);
      GVar2 = (*gl->getError)();
      bVar1 = SparseTextureUtils::verifyError(log,"TexStorage [wrong depth]",GVar2,0x501);
      if (!bVar1) {
LAB_00ad4fec:
        gl4cts::Texture::Delete(gl,&texture);
        return false;
      }
    }
  }
  gl4cts::Texture::Delete(gl,&texture);
  return true;
}

Assistant:

bool SparseTextureAllocationTestCase::verifyTexStorageInvalidValueErrors(const Functions& gl, GLint target,
																		 GLint format)
{
	mLog << "Verify Invalid Value errors - ";

	GLuint texture;
	GLint  pageSizeX;
	GLint  pageSizeY;
	GLint  pageSizeZ;
	SparseTextureUtils::getTexturePageSizes(gl, target, format, pageSizeX, pageSizeY, pageSizeZ);

	Texture::Generate(gl, texture);
	Texture::Bind(gl, texture, target);

	GLint width  = pageSizeX;
	GLint height = pageSizeY;
	GLint depth  = SparseTextureUtils::getTargetDepth(target) * pageSizeZ;

	if (target == GL_TEXTURE_3D)
	{
		GLint max3DTextureSize;

		gl.getIntegerv(GL_MAX_SPARSE_3D_TEXTURE_SIZE_ARB, &max3DTextureSize);
		if (!SparseTextureUtils::verifyQueryError(mLog, "getIntegerv", target, GL_MAX_SPARSE_3D_TEXTURE_SIZE_ARB,
												  gl.getError(), GL_NO_ERROR))
		{
			Texture::Delete(gl, texture);
			return false;
		}

		// Check 3 different cases:
		// 1) wrong width
		// 2) wrong height
		// 3) wrong depth
		Texture::Storage(gl, target, 1, format, width + max3DTextureSize, height, depth);
		if (!SparseTextureUtils::verifyError(mLog, "TexStorage [GL_TEXTURE_3D wrong width]", gl.getError(),
											 GL_INVALID_VALUE))
		{
			Texture::Delete(gl, texture);
			return false;
		}

		Texture::Storage(gl, target, 1, format, width, height + max3DTextureSize, depth);
		if (!SparseTextureUtils::verifyError(mLog, "TexStorage [GL_TEXTURE_3D wrong height]", gl.getError(),
											 GL_INVALID_VALUE))
		{
			Texture::Delete(gl, texture);
			return false;
		}

		Texture::Storage(gl, target, 1, format, width, height, depth + max3DTextureSize);
		if (!SparseTextureUtils::verifyError(mLog, "TexStorage [GL_TEXTURE_3D wrong depth]", gl.getError(),
											 GL_INVALID_VALUE))
		{
			Texture::Delete(gl, texture);
			return false;
		}
	}
	else
	{
		GLint maxTextureSize;

		gl.getIntegerv(GL_MAX_SPARSE_TEXTURE_SIZE_ARB, &maxTextureSize);
		if (!SparseTextureUtils::verifyQueryError(mLog, "getIntegerv", target, GL_MAX_SPARSE_TEXTURE_SIZE_ARB,
												  gl.getError(), GL_NO_ERROR))
		{
			Texture::Delete(gl, texture);
			return false;
		}

		// Check 3 different cases:
		// 1) wrong width
		// 2) wrong height
		Texture::Storage(gl, target, 1, format, width + maxTextureSize, height, depth);
		if (!SparseTextureUtils::verifyError(mLog, "TexStorage [!GL_TEXTURE_3D wrong width]", gl.getError(),
											 GL_INVALID_VALUE))
		{
			Texture::Delete(gl, texture);
			return false;
		}

		Texture::Storage(gl, target, 1, format, width, height + maxTextureSize, depth);
		if (!SparseTextureUtils::verifyError(mLog, "TexStorage [!GL_TEXTURE_3D wrong height]", gl.getError(),
											 GL_INVALID_VALUE))
		{
			Texture::Delete(gl, texture);
			return false;
		}

		GLint maxArrayTextureLayers;

		gl.getIntegerv(GL_MAX_SPARSE_ARRAY_TEXTURE_LAYERS_ARB, &maxArrayTextureLayers);
		if (!SparseTextureUtils::verifyQueryError(mLog, "getIntegerv", target, GL_MAX_SPARSE_ARRAY_TEXTURE_LAYERS_ARB,
												  gl.getError(), GL_NO_ERROR))
		{
			Texture::Delete(gl, texture);
			return false;
		}

		if (target == GL_TEXTURE_1D_ARRAY)
		{
			Texture::Storage(gl, target, 1, format, width, height + maxArrayTextureLayers, 0);
			if (!SparseTextureUtils::verifyError(mLog, "TexStorage [ARRAY wrong height]", gl.getError(),
												 GL_INVALID_VALUE))
			{
				Texture::Delete(gl, texture);
				return false;
			}
		}
		else if ((target == GL_TEXTURE_2D_ARRAY || target == GL_TEXTURE_CUBE_MAP_ARRAY))
		{
			Texture::Storage(gl, target, 1, format, width, height, depth + maxArrayTextureLayers);
			if (!SparseTextureUtils::verifyError(mLog, "TexStorage [ARRAY wrong depth]", gl.getError(),
												 GL_INVALID_VALUE))
			{
				Texture::Delete(gl, texture);
				return false;
			}
		}
	}

	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture2"))
	{
		if (pageSizeX > 1)
		{
			Texture::Storage(gl, target, 1, format, 1, height, depth);
			if (!SparseTextureUtils::verifyError(mLog, "TexStorage [wrong width]", gl.getError(), GL_INVALID_VALUE))
			{
				Texture::Delete(gl, texture);
				return false;
			}
		}

		if (pageSizeY > 1)
		{
			Texture::Storage(gl, target, 1, format, width, 1, depth);
			if (!SparseTextureUtils::verifyError(mLog, "TexStorage [wrong height]", gl.getError(), GL_INVALID_VALUE))
			{
				Texture::Delete(gl, texture);
				return false;
			}
		}

		if (pageSizeZ > 1)
		{
			Texture::Storage(gl, target, 1, format, width, height, SparseTextureUtils::getTargetDepth(target));
			if (!SparseTextureUtils::verifyError(mLog, "TexStorage [wrong depth]", gl.getError(), GL_INVALID_VALUE))
			{
				Texture::Delete(gl, texture);
				return false;
			}
		}
	}

	Texture::Delete(gl, texture);
	return true;
}